

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_open_res_raw(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_rcdesc rc;
  vm_rcdesc local_60;
  
  CVmMetaclass::get_class_obj(metaclass_reg_);
  vm_rcdesc::init(&local_60,(EVP_PKEY_CTX *)"File.openRawResource");
  open_binary(retval,argc,3,1,&local_60);
  return 1;
}

Assistant:

int CVmObjFile::getp_open_res_raw(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *argc)
{
    vm_rcdesc rc(vmg_ "File.openRawResource",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_OPEN_RES_RAW, G_stk->get(0), argc);
    return s_getp_open_raw(vmg_ retval, argc, TRUE, &rc);
}